

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O3

int erkStep_CheckNVector(N_Vector tmpl)

{
  N_Vector_Ops p_Var1;
  uint uVar2;
  
  p_Var1 = tmpl->ops;
  uVar2 = 0;
  if ((((p_Var1->nvclone != (_func_N_Vector_N_Vector *)0x0) &&
       (p_Var1->nvdestroy != (_func_void_N_Vector *)0x0)) &&
      (p_Var1->nvlinearsum != (_func_void_realtype_N_Vector_realtype_N_Vector_N_Vector *)0x0)) &&
     ((p_Var1->nvconst != (_func_void_realtype_N_Vector *)0x0 &&
      (p_Var1->nvscale != (_func_void_realtype_N_Vector_N_Vector *)0x0)))) {
    uVar2 = (uint)(p_Var1->nvwrmsnorm != (_func_realtype_N_Vector_N_Vector *)0x0);
  }
  return uVar2;
}

Assistant:

booleantype erkStep_CheckNVector(N_Vector tmpl)
{
  if ( (tmpl->ops->nvclone     == NULL) ||
       (tmpl->ops->nvdestroy   == NULL) ||
       (tmpl->ops->nvlinearsum == NULL) ||
       (tmpl->ops->nvconst     == NULL) ||
       (tmpl->ops->nvscale     == NULL) ||
       (tmpl->ops->nvwrmsnorm  == NULL) )
    return(SUNFALSE);
  return(SUNTRUE);
}